

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

void ecpAddJ(word *c,word *a,word *b,ec_o *ec,void *stack)

{
  bool_t bVar1;
  int iVar2;
  size_t *psVar3;
  long in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *t4;
  word *t3;
  word *t2;
  word *t1;
  size_t n;
  size_t in_stack_ffffffffffffffa0;
  word *in_stack_ffffffffffffffa8;
  ec_o *ec_00;
  word *a_00;
  word *c_00;
  word *c_01;
  
  c_01 = *(word **)(*(long *)(in_RCX + 0x18) + 0x30);
  c_00 = in_R8 + (long)c_01;
  a_00 = c_00 + (long)c_01;
  ec_00 = (ec_o *)(a_00 + (long)c_01);
  psVar3 = &(ec_00->hdr).keep + (long)c_01;
  bVar1 = wwIsZero(in_RSI + (long)c_01 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
  if (bVar1 == 0) {
    bVar1 = wwIsZero(in_RDX + (long)c_01 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
    if (bVar1 == 0) {
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                (in_R8,in_RSI + (long)c_01 * 2,*(undefined8 *)(in_RCX + 0x18),psVar3);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                (c_00,in_RDX + (long)c_01 * 2,*(undefined8 *)(in_RCX + 0x18),psVar3);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (a_00,in_RDX + (long)c_01 * 2,c_00,*(undefined8 *)(in_RCX + 0x18),psVar3);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (a_00,in_RSI + (long)c_01,a_00,*(undefined8 *)(in_RCX + 0x18),psVar3);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (ec_00,in_RSI + (long)c_01 * 2,in_R8,*(undefined8 *)(in_RCX + 0x18),psVar3);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (ec_00,in_RDX + (long)c_01,ec_00,*(undefined8 *)(in_RCX + 0x18),psVar3);
      zzAddMod(c_01,in_R8,c_00,a_00,(size_t)ec_00);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                (in_RDI + (long)c_01 * 2,in_RDI + (long)c_01 * 2,*(undefined8 *)(in_RCX + 0x18),
                 psVar3);
      zzSubMod(c_00,a_00,(word *)ec_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      zzSubMod(c_00,a_00,(word *)ec_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (in_R8,in_RDX,in_R8,*(undefined8 *)(in_RCX + 0x18),psVar3);
      (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                (c_00,in_RSI,c_00,*(undefined8 *)(in_RCX + 0x18),psVar3);
      zzSubMod(c_00,a_00,(word *)ec_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      bVar1 = wwIsZero(in_R8,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
      if (bVar1 == 0) {
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_RDI + (long)c_01 * 2,in_RDI + (long)c_01 * 2,in_R8,
                   *(undefined8 *)(in_RCX + 0x18),psVar3);
        zzSubMod(c_00,a_00,(word *)ec_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        zzDoubleMod(c_01,in_R8,c_00,(size_t)a_00);
        zzDoubleMod(c_01,in_R8,c_00,(size_t)a_00);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                  (in_RDI + (long)c_01,in_RDI + (long)c_01,*(undefined8 *)(in_RCX + 0x18),psVar3);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_R8,in_R8,in_RDI + (long)c_01,*(undefined8 *)(in_RCX + 0x18),psVar3);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_RDI + (long)c_01,c_00,in_RDI + (long)c_01,*(undefined8 *)(in_RCX + 0x18),
                   psVar3);
        zzDoubleMod(c_01,in_R8,c_00,(size_t)a_00);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x70))
                  (in_RDI,ec_00,*(undefined8 *)(in_RCX + 0x18),psVar3);
        zzSubMod(c_00,a_00,(word *)ec_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        zzSubMod(c_00,a_00,(word *)ec_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        zzSubMod(c_00,a_00,(word *)ec_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (in_RDI + (long)c_01,ec_00,in_RDI + (long)c_01,*(undefined8 *)(in_RCX + 0x18),
                   psVar3);
        zzDoubleMod(c_01,in_R8,c_00,(size_t)a_00);
        (**(code **)(*(long *)(in_RCX + 0x18) + 0x68))
                  (a_00,a_00,in_R8,*(undefined8 *)(in_RCX + 0x18),psVar3);
        zzSubMod(c_00,a_00,(word *)ec_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      }
      else {
        iVar2 = wwCmp(a_00,(word *)ec_00,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        if (iVar2 == 0) {
          ecpDblJ(c_00,a_00,ec_00,in_RDI);
        }
        else {
          wwSetZero(in_RDI + (long)c_01 * 2,*(size_t *)(*(long *)(in_RCX + 0x18) + 0x30));
        }
      }
    }
    else {
      wwCopy(in_RDI,in_RSI,(long)c_01 * 3);
    }
  }
  else {
    wwCopy(in_RDI,in_RDX,(long)c_01 * 3);
  }
  return;
}

Assistant:

static void ecpAddJ(word c[], const word a[], const word b[], const ec_o* ec,
	void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	word* t4 = t3 + n;
	stack = t4 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(ecpSeemsOn3(b, ec));
	ASSERT(wwIsSameOrDisjoint(a, c, 3 * n));
	ASSERT(wwIsSameOrDisjoint(b, c, 3 * n));
	// a == O => c <- b
	if (qrIsZero(ecZ(a, n), ec->f))
	{
		wwCopy(c, b, 3 * n);
		return;
	}
	// b == O => c <- a
	if (qrIsZero(ecZ(b, n), ec->f))
	{
		wwCopy(c, a, 3 * n);
		return;
	}
	// t1 <- za^2 [Z1Z1]
	qrSqr(t1, ecZ(a, n), ec->f, stack);
	// t2 <- zb^2 [Z2Z2]
	qrSqr(t2, ecZ(b, n), ec->f, stack);
	// t3 <- zb t2 [Z2 Z2Z2]
	qrMul(t3, ecZ(b, n), t2, ec->f, stack);
	// t3 <- ya t3 [Y1 Z2 Z2Z2 = S1]
	qrMul(t3, ecY(a, n), t3, ec->f, stack);
	// t4 <- za t1 [Z1 Z1Z1]
	qrMul(t4, ecZ(a, n), t1, ec->f, stack);
	// t4 <- yb t4 [Y2 Z1 Z1Z1 = S2]
	qrMul(t4, ecY(b, n), t4, ec->f, stack);
	// zc <- za + zb [Z1 + Z2]
	zmAdd(ecZ(c, n), ecZ(a, n), ecZ(b, n), ec->f);
	// zc <- zc^2 [(Z1 + Z2)^2]
	qrSqr(ecZ(c, n), ecZ(c, n), ec->f, stack);
	// zc <- zc - t1 [(Z1 + Z2)^2 - Z1Z1]
	zmSub(ecZ(c, n), ecZ(c, n), t1, ec->f);
	// zc <- zc - t2 [(Z1 + Z2)^2 - Z1Z1 - Z2Z2]
	zmSub(ecZ(c, n), ecZ(c, n), t2, ec->f);
	// t1 <- xb t1 [X1 Z2Z2 = U2]
	qrMul(t1, ecX(b), t1, ec->f, stack);
	// t2 <- xa t2 [X2 Z1Z1 = U1]
	qrMul(t2, ecX(a), t2, ec->f, stack);
	// t1 <- t1 - t2 [U2 - U1 = H]
	zmSub(t1, t1, t2, ec->f);
	// t1 == 0 => xa zb^2 == xb za^2
	if (qrIsZero(t1, ec->f))
	{
		// t3 == t4 => ya zb^3 == yb za^3 => a == b => c <- 2a
		if (qrCmp(t3, t4, ec->f) == 0)
			ecpDblJ(c, c == a ? b : a, ec, stack);
		// t3 != t4 => a == -b => c <- O
		else
			qrSetZero(ecZ(c, n), ec->f);
		return;
	}
	// zc <- zc t1 [((Z1 + Z2)^2 - Z1Z1 - Z2Z2)H = Z3]
	qrMul(ecZ(c, n), ecZ(c, n), t1, ec->f, stack);
	// t4 <- t4 - t3 [S2 - S1]
	zmSub(t4, t4, t3, ec->f);
	// t4 <- 2 t4 [2(S2 - S1) = r]
	gfpDouble(t4, t4, ec->f);
	// yc <- 2 t1 [2H]
	gfpDouble(ecY(c, n), t1, ec->f);
	// yc <- yc^2 [(2H)^2 = I]
	qrSqr(ecY(c, n), ecY(c, n), ec->f, stack);
	// t1 <- t1 yc [H I = J]
	qrMul(t1, t1, ecY(c, n), ec->f, stack);
	// yc <- t2 yc [U1 I = V]
	qrMul(ecY(c, n), t2, ecY(c, n), ec->f, stack);
	// t2 <- 2 yc [2 V]
	gfpDouble(t2, ecY(c, n), ec->f);
	// xc <- t4^2 [r^2]
	qrSqr(ecX(c), t4, ec->f, stack);
	// xc <- xc - t1 [r^2 - J]
	zmSub(ecX(c), ecX(c), t1, ec->f);
	// xc <- xc - t2 [r^2 - J - 2V = X3]
	zmSub(ecX(c), ecX(c), t2, ec->f);
	// yc <- yc - xc [V - X3]
	zmSub(ecY(c, n), ecY(c, n), ecX(c), ec->f);
	// yc <- t4 yc [r(V - X3)]
	qrMul(ecY(c, n), t4, ecY(c, n), ec->f, stack);
	// t3 <- 2 t3 [2S1]
	gfpDouble(t3, t3, ec->f);
	// t3 <- t3 t1 [2S1 J]
	qrMul(t3, t3, t1, ec->f, stack);
	// yc <- yc - t3 [r(V - X3) - 2 S1 J]
	zmSub(ecY(c, n), ecY(c, n), t3, ec->f);
}